

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O2

ParserString
GeneratedSaxParser::Utils::toStringListItem(ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  size_t sVar4;
  byte *pbVar5;
  ParserString PVar6;
  
  pbVar5 = (byte *)*buffer;
  if ((pbVar5 == (byte *)0x0) || (pbVar5 == (byte *)bufferEnd)) {
    *failed = true;
    pbVar3 = (byte *)0x0;
    sVar4 = 0;
    goto LAB_00841144;
  }
  do {
    if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) {
      pbVar3 = (byte *)0x0;
      sVar4 = 0;
      bVar2 = false;
      goto LAB_00841155;
    }
    pbVar5 = pbVar5 + 1;
  } while (pbVar5 != (byte *)bufferEnd);
LAB_0084112e:
  *failed = true;
  *buffer = bufferEnd;
LAB_00841134:
  pbVar3 = (byte *)0x0;
  sVar4 = 0;
LAB_00841144:
  PVar6.super_UnionString.length = sVar4;
  PVar6.super_UnionString.str = (ParserChar *)pbVar3;
  return (ParserString)PVar6.super_UnionString;
LAB_00841155:
  pbVar1 = pbVar5 + sVar4;
  if (pbVar1 == (byte *)bufferEnd) goto LAB_00841199;
  if (((ulong)*pbVar1 < 0x21) && ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0)) {
    if (bVar2) {
      *buffer = (ParserChar *)pbVar1;
      *failed = false;
      goto LAB_00841144;
    }
    *failed = true;
    *buffer = (ParserChar *)pbVar1;
    goto LAB_00841134;
  }
  if (!bVar2) {
    bVar2 = true;
    pbVar3 = pbVar1;
  }
  sVar4 = sVar4 + 1;
  goto LAB_00841155;
LAB_00841199:
  if (bVar2) {
    *failed = false;
    *buffer = bufferEnd;
    goto LAB_00841144;
  }
  goto LAB_0084112e;
}

Assistant:

ParserString Utils::toStringListItem(const ParserChar** buffer, const ParserChar* bufferEnd, bool& failed)
    {
        ParserString value;

        const ParserChar* s = *buffer;
        if ( !s )
        {
            failed = true;
            return value;
        }

        if ( s == bufferEnd )
        {
            failed = true;
            *buffer = bufferEnd;
            return value;
        }

        // Skip leading white spaces
        while ( isWhiteSpace(*s) )
        {
            ++s;
            if ( s == bufferEnd )
            {
                failed = true;
                *buffer = bufferEnd;
                return value;
            }
        }

        bool characterFound = false;
        while (true)
        {
            if ( s == bufferEnd )
            {
                if (characterFound)
                {
                    failed = false;
                    *buffer = s;
                    return value;
                }
                else
                {
                    failed = true;
                    *buffer = s;
                    value.str = 0;
                    value.length = 0;
                    return value;
                }
            }

            if ( !isWhiteSpace(*s) )
            {
                if (!characterFound)
                {
                    value.str = s;
                    characterFound = true;
                }
                value.length++;
            }
            else
                break;
            ++s;
        }
        if ( characterFound )
        {
            *buffer = s;
            failed = false;
            return value;
        }
        else
        {
            failed = true;
            *buffer = s;
            value.str = 0;
            value.length = 0;
            return value;
        }
    }